

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowing(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ImGuiInputSource IVar5;
  int focus_change_dir_00;
  bool bVar6;
  float fVar7;
  float fVar8;
  ImGuiNavLayer local_bc;
  ImGuiWindow *local_90;
  bool local_85;
  ImGuiNavLayer new_nav_layer;
  ImGuiWindow *old_nav_window;
  ImGuiWindow *new_nav_window;
  ImVec2 local_64;
  float local_5c;
  undefined4 local_58;
  float move_speed;
  float NAV_MOVE_SPEED;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 move_delta;
  int focus_change_dir;
  ImGuiWindow *window;
  bool start_windowing_with_keyboard;
  bool start_windowing_with_gamepad;
  ImGuiWindow *modal_window;
  ImGuiWindow *pIStack_18;
  bool apply_toggle_layer;
  ImGuiWindow *apply_focus_window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIStack_18 = (ImGuiWindow *)0x0;
  bVar6 = false;
  pIVar4 = GetTopMostPopupModal();
  if (pIVar4 != (ImGuiWindow *)0x0) {
    pIVar1->NavWindowingTarget = (ImGuiWindow *)0x0;
    return;
  }
  if ((pIVar1->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar7 = ImMax<float>(-(pIVar1->IO).DeltaTime * 10.0 + pIVar1->NavWindowingHighlightAlpha,0.0);
    pIVar1->NavWindowingHighlightAlpha = fVar7;
    if ((pIVar1->DimBgRatio <= 0.0) && (pIVar1->NavWindowingHighlightAlpha <= 0.0)) {
      pIVar1->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  local_85 = false;
  if (pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0) {
    local_85 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
  }
  bVar3 = false;
  if ((pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0) &&
     (bVar3 = false, ((pIVar1->IO).KeyCtrl & 1U) != 0)) {
    bVar2 = IsKeyPressedMap(0,true);
    bVar3 = false;
    if (bVar2) {
      bVar3 = ((pIVar1->IO).ConfigFlags & 1U) != 0;
    }
  }
  if ((local_85 != false) || (bVar3)) {
    if (pIVar1->NavWindow == (ImGuiWindow *)0x0) {
      local_90 = FindWindowNavFocusable((pIVar1->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    else {
      local_90 = pIVar1->NavWindow;
    }
    stack0xffffffffffffffc8 = local_90;
    if (local_90 != (ImGuiWindow *)0x0) {
      pIVar1->NavWindowingTargetAnim = local_90;
      pIVar1->NavWindowingTarget = local_90;
      pIVar1->NavWindowingHighlightAlpha = 0.0;
      pIVar1->NavWindowingTimer = 0.0;
      pIVar1->NavWindowingToggleLayer = (bool)(bVar3 + '\x01');
      IVar5 = ImGuiInputSource_NavGamepad;
      if (bVar3) {
        IVar5 = ImGuiInputSource_NavKeyboard;
      }
      pIVar1->NavInputSource = IVar5;
    }
  }
  pIVar1->NavWindowingTimer = (pIVar1->IO).DeltaTime + pIVar1->NavWindowingTimer;
  if ((pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar1->NavInputSource == ImGuiInputSource_NavGamepad)) {
    fVar7 = pIVar1->NavWindowingHighlightAlpha;
    fVar8 = ImSaturate((pIVar1->NavWindowingTimer - 0.2) / 0.05);
    fVar7 = ImMax<float>(fVar7,fVar8);
    pIVar1->NavWindowingHighlightAlpha = fVar7;
    bVar3 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar2 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    move_delta.x = (float)((uint)bVar3 - (uint)bVar2);
    if (move_delta.x != 0.0) {
      NavUpdateWindowingHighlightWindow((int)move_delta.x);
      pIVar1->NavWindowingHighlightAlpha = 1.0;
    }
    bVar3 = IsNavInputDown(3);
    if (!bVar3) {
      pIVar1->NavWindowingToggleLayer =
           (pIVar1->NavWindowingToggleLayer & 1U &
           (pIVar1->NavWindowingHighlightAlpha <= 1.0 && pIVar1->NavWindowingHighlightAlpha != 1.0))
           != 0;
      if (((pIVar1->NavWindowingToggleLayer & 1U) == 0) || (pIVar1->NavWindow == (ImGuiWindow *)0x0)
         ) {
        if ((pIVar1->NavWindowingToggleLayer & 1U) == 0) {
          pIStack_18 = pIVar1->NavWindowingTarget;
        }
      }
      else {
        bVar6 = true;
      }
      pIVar1->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar1->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    fVar7 = pIVar1->NavWindowingHighlightAlpha;
    fVar8 = ImSaturate((pIVar1->NavWindowingTimer - 0.2) / 0.05);
    fVar7 = ImMax<float>(fVar7,fVar8);
    pIVar1->NavWindowingHighlightAlpha = fVar7;
    bVar3 = IsKeyPressedMap(0,true);
    if (bVar3) {
      focus_change_dir_00 = -1;
      if (((pIVar1->IO).KeyShift & 1U) != 0) {
        focus_change_dir_00 = 1;
      }
      NavUpdateWindowingHighlightWindow(focus_change_dir_00);
    }
    if (((pIVar1->IO).KeyCtrl & 1U) == 0) {
      pIStack_18 = pIVar1->NavWindowingTarget;
    }
  }
  bVar3 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
  if (bVar3) {
    pIVar1->NavWindowingToggleLayer = true;
  }
  if ((((pIVar1->ActiveId == 0) || ((pIVar1->ActiveIdAllowOverlap & 1U) != 0)) &&
      ((pIVar1->NavWindowingToggleLayer & 1U) != 0)) &&
     (bVar3 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar3)) {
    bVar3 = IsMousePosValid(&(pIVar1->IO).MousePos);
    bVar2 = IsMousePosValid(&(pIVar1->IO).MousePosPrev);
    if (bVar3 == bVar2) {
      bVar6 = true;
    }
  }
  if ((pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((pIVar1->NavWindowingTarget->Flags & 4U) == 0)) {
    ImVec2::ImVec2(&local_44);
    if ((pIVar1->NavInputSource == ImGuiInputSource_NavKeyboard) &&
       (((pIVar1->IO).KeyShift & 1U) == 0)) {
      local_4c = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      local_44 = local_4c;
    }
    if (pIVar1->NavInputSource == ImGuiInputSource_NavGamepad) {
      _move_speed = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      local_44 = _move_speed;
    }
    if ((local_44.x == 0.0) && (!NAN(local_44.x))) {
      if ((local_44.y == 0.0) && (!NAN(local_44.y))) goto LAB_0025ecf9;
    }
    local_58 = 0x44480000;
    fVar7 = (pIVar1->IO).DeltaTime;
    fVar8 = ImMin<float>((pIVar1->IO).DisplayFramebufferScale.x,
                         (pIVar1->IO).DisplayFramebufferScale.y);
    local_5c = ImFloor(fVar7 * 800.0 * fVar8);
    pIVar4 = pIVar1->NavWindowingTarget->RootWindow;
    register0x00001200 = ::operator*(&local_44,local_5c);
    local_64 = ::operator+(&pIVar4->Pos,(ImVec2 *)((long)&new_nav_window + 4));
    SetWindowPos(pIVar4,&local_64,1);
    pIVar1->NavDisableMouseHover = true;
    MarkIniSettingsDirty(pIVar1->NavWindowingTarget);
  }
LAB_0025ecf9:
  if ((pIStack_18 != (ImGuiWindow *)0x0) &&
     ((pIVar1->NavWindow == (ImGuiWindow *)0x0 || (pIStack_18 != pIVar1->NavWindow->RootWindow)))) {
    ClearActiveID();
    pIVar1->NavDisableHighlight = false;
    pIVar1->NavDisableMouseHover = true;
    pIStack_18 = NavRestoreLastChildNavWindow(pIStack_18);
    ClosePopupsOverWindow(pIStack_18,false);
    FocusWindow(pIStack_18);
    if (pIStack_18->NavLastIds[0] == 0) {
      NavInitWindow(pIStack_18,false);
    }
    if ((pIStack_18->DC).NavLayerActiveMask == 2) {
      pIVar1->NavLayer = ImGuiNavLayer_Menu;
    }
  }
  if (pIStack_18 != (ImGuiWindow *)0x0) {
    pIVar1->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar6) && (pIVar1->NavWindow != (ImGuiWindow *)0x0)) {
    old_nav_window = pIVar1->NavWindow;
    while( true ) {
      bVar6 = false;
      if (((old_nav_window->ParentWindow != (ImGuiWindow *)0x0) &&
          (bVar6 = false, ((old_nav_window->DC).NavLayerActiveMask & 2U) == 0)) &&
         (bVar6 = false, (old_nav_window->Flags & 0x1000000U) != 0)) {
        bVar6 = (old_nav_window->Flags & 0x14000000U) == 0;
      }
      if (!bVar6) break;
      old_nav_window = old_nav_window->ParentWindow;
    }
    if (old_nav_window != pIVar1->NavWindow) {
      pIVar4 = pIVar1->NavWindow;
      FocusWindow(old_nav_window);
      old_nav_window->NavLastChildNavWindow = pIVar4;
    }
    pIVar1->NavDisableHighlight = false;
    pIVar1->NavDisableMouseHover = true;
    if (((pIVar1->NavWindow->DC).NavLayerActiveMask & 2U) == 0) {
      local_bc = ImGuiNavLayer_Main;
    }
    else {
      local_bc = pIVar1->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(local_bc);
  }
  return;
}

Assistant:

static void ImGui::NavUpdateWindowing()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* apply_focus_window = NULL;
    bool apply_toggle_layer = false;

    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window != NULL)
    {
        g.NavWindowingTarget = NULL;
        return;
    }

    // Fade out
    if (g.NavWindowingTargetAnim && g.NavWindowingTarget == NULL)
    {
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha - g.IO.DeltaTime * 10.0f, 0.0f);
        if (g.DimBgRatio <= 0.0f && g.NavWindowingHighlightAlpha <= 0.0f)
            g.NavWindowingTargetAnim = NULL;
    }

    // Start CTRL-TAB or Square+L/R window selection
    bool start_windowing_with_gamepad = !g.NavWindowingTarget && IsNavInputTest(ImGuiNavInput_Menu, ImGuiInputReadMode_Pressed);
    bool start_windowing_with_keyboard = !g.NavWindowingTarget && g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab) && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard);
    if (start_windowing_with_gamepad || start_windowing_with_keyboard)
        if (ImGuiWindow* window = g.NavWindow ? g.NavWindow : FindWindowNavFocusable(g.WindowsFocusOrder.Size - 1, -INT_MAX, -1))
        {
            g.NavWindowingTarget = g.NavWindowingTargetAnim = window;
            g.NavWindowingTimer = g.NavWindowingHighlightAlpha = 0.0f;
            g.NavWindowingToggleLayer = start_windowing_with_keyboard ? false : true;
            g.NavInputSource = start_windowing_with_keyboard ? ImGuiInputSource_NavKeyboard : ImGuiInputSource_NavGamepad;
        }

    // Gamepad update
    g.NavWindowingTimer += g.IO.DeltaTime;
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_NavGamepad)
    {
        // Highlight only appears after a brief time holding the button, so that a fast tap on PadMenu (to toggle NavLayer) doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f));

        // Select window to focus
        const int focus_change_dir = (int)IsNavInputTest(ImGuiNavInput_FocusPrev, ImGuiInputReadMode_RepeatSlow) - (int)IsNavInputTest(ImGuiNavInput_FocusNext, ImGuiInputReadMode_RepeatSlow);
        if (focus_change_dir != 0)
        {
            NavUpdateWindowingHighlightWindow(focus_change_dir);
            g.NavWindowingHighlightAlpha = 1.0f;
        }

        // Single press toggles NavLayer, long press with L/R apply actual focus on release (until then the window was merely rendered top-most)
        if (!IsNavInputDown(ImGuiNavInput_Menu))
        {
            g.NavWindowingToggleLayer &= (g.NavWindowingHighlightAlpha < 1.0f); // Once button was held long enough we don't consider it a tap-to-toggle-layer press anymore.
            if (g.NavWindowingToggleLayer && g.NavWindow)
                apply_toggle_layer = true;
            else if (!g.NavWindowingToggleLayer)
                apply_focus_window = g.NavWindowingTarget;
            g.NavWindowingTarget = NULL;
        }
    }

    // Keyboard: Focus
    if (g.NavWindowingTarget && g.NavInputSource == ImGuiInputSource_NavKeyboard)
    {
        // Visuals only appears after a brief time after pressing TAB the first time, so that a fast CTRL+TAB doesn't add visual noise
        g.NavWindowingHighlightAlpha = ImMax(g.NavWindowingHighlightAlpha, ImSaturate((g.NavWindowingTimer - NAV_WINDOWING_HIGHLIGHT_DELAY) / 0.05f)); // 1.0f
        if (IsKeyPressedMap(ImGuiKey_Tab, true))
            NavUpdateWindowingHighlightWindow(g.IO.KeyShift ? +1 : -1);
        if (!g.IO.KeyCtrl)
            apply_focus_window = g.NavWindowingTarget;
    }

    // Keyboard: Press and Release ALT to toggle menu layer
    // FIXME: We lack an explicit IO variable for "is the imgui window focused", so compare mouse validity to detect the common case of back-end clearing releases all keys on ALT-TAB
    if (IsNavInputTest(ImGuiNavInput_KeyMenu_, ImGuiInputReadMode_Pressed))
        g.NavWindowingToggleLayer = true;
    if ((g.ActiveId == 0 || g.ActiveIdAllowOverlap) && g.NavWindowingToggleLayer && IsNavInputTest(ImGuiNavInput_KeyMenu_, ImGuiInputReadMode_Released))
        if (IsMousePosValid(&g.IO.MousePos) == IsMousePosValid(&g.IO.MousePosPrev))
            apply_toggle_layer = true;

    // Move window
    if (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoMove))
    {
        ImVec2 move_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && !g.IO.KeyShift)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            move_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadLStick, ImGuiInputReadMode_Down);
        if (move_delta.x != 0.0f || move_delta.y != 0.0f)
        {
            const float NAV_MOVE_SPEED = 800.0f;
            const float move_speed = ImFloor(NAV_MOVE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y)); // FIXME: Doesn't code variable framerate very well
            SetWindowPos(g.NavWindowingTarget->RootWindow, g.NavWindowingTarget->RootWindow->Pos + move_delta * move_speed, ImGuiCond_Always);
            g.NavDisableMouseHover = true;
            MarkIniSettingsDirty(g.NavWindowingTarget);
        }
    }

    // Apply final focus
    if (apply_focus_window && (g.NavWindow == NULL || apply_focus_window != g.NavWindow->RootWindow))
    {
        ClearActiveID();
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;
        apply_focus_window = NavRestoreLastChildNavWindow(apply_focus_window);
        ClosePopupsOverWindow(apply_focus_window, false);
        FocusWindow(apply_focus_window);
        if (apply_focus_window->NavLastIds[0] == 0)
            NavInitWindow(apply_focus_window, false);

        // If the window only has a menu layer, select it directly
        if (apply_focus_window->DC.NavLayerActiveMask == (1 << ImGuiNavLayer_Menu))
            g.NavLayer = ImGuiNavLayer_Menu;
    }
    if (apply_focus_window)
        g.NavWindowingTarget = NULL;

    // Apply menu/layer toggle
    if (apply_toggle_layer && g.NavWindow)
    {
        // Move to parent menu if necessary
        ImGuiWindow* new_nav_window = g.NavWindow;
        while (new_nav_window->ParentWindow
            && (new_nav_window->DC.NavLayerActiveMask & (1 << ImGuiNavLayer_Menu)) == 0
            && (new_nav_window->Flags & ImGuiWindowFlags_ChildWindow) != 0
            && (new_nav_window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu)) == 0)
            new_nav_window = new_nav_window->ParentWindow;
        if (new_nav_window != g.NavWindow)
        {
            ImGuiWindow* old_nav_window = g.NavWindow;
            FocusWindow(new_nav_window);
            new_nav_window->NavLastChildNavWindow = old_nav_window;
        }
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = true;

        // When entering a regular menu bar with the Alt key, we always reinitialize the navigation ID.
        const ImGuiNavLayer new_nav_layer = (g.NavWindow->DC.NavLayerActiveMask & (1 << ImGuiNavLayer_Menu)) ? (ImGuiNavLayer)((int)g.NavLayer ^ 1) : ImGuiNavLayer_Main;
        NavRestoreLayer(new_nav_layer);
    }
}